

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

ostream * mjs::operator<<(ostream *os,token_type t)

{
  long lVar1;
  char *pcVar2;
  
  switch(t) {
  case whitespace:
    pcVar2 = "whitespace";
    goto LAB_0016b62f;
  case line_terminator:
    pcVar2 = "line_terminator";
    goto LAB_0016b50d;
  case identifier:
    pcVar2 = "identifier";
    goto LAB_0016b62f;
  case numeric_literal:
    pcVar2 = "numeric_literal";
    goto LAB_0016b50d;
  case string_literal:
    pcVar2 = "string_literal";
    lVar1 = 0xe;
    goto LAB_0016b7ec;
  case rshiftshiftequal:
    pcVar2 = "rshiftshiftequal";
    lVar1 = 0x10;
    goto LAB_0016b7ec;
  case rshiftshift:
    pcVar2 = "rshiftshift";
    goto LAB_0016b5e9;
  case lshiftequal:
    pcVar2 = "lshiftequal";
    goto LAB_0016b5e9;
  case rshiftequal:
    pcVar2 = "rshiftequal";
    goto LAB_0016b5e9;
  case equalequalequal:
    pcVar2 = "equalequalequal";
LAB_0016b50d:
    lVar1 = 0xf;
    goto LAB_0016b7ec;
  case notequalequal:
    pcVar2 = "notequalequal";
    goto LAB_0016b6c9;
  case equalequal:
    pcVar2 = "equalequal";
    goto LAB_0016b62f;
  case notequal:
    pcVar2 = "notequal";
    goto LAB_0016b776;
  case ltequal:
    pcVar2 = "ltequal";
    goto LAB_0016b757;
  case gtequal:
    pcVar2 = "gtequal";
    goto LAB_0016b757;
  case andand:
    pcVar2 = "andand";
    break;
  case oror:
    pcVar2 = "oror";
    goto LAB_0016b7bf;
  case plusplus:
    pcVar2 = "plusplus";
    goto LAB_0016b776;
  case minusminus:
    pcVar2 = "minusminus";
    goto LAB_0016b62f;
  case lshift:
    pcVar2 = "lshift";
    break;
  case rshift:
    pcVar2 = "rshift";
    break;
  case plusequal:
    pcVar2 = "plusequal";
    goto LAB_0016b768;
  case minusequal:
    pcVar2 = "minusequal";
    goto LAB_0016b62f;
  case multiplyequal:
    pcVar2 = "multiplyequal";
LAB_0016b6c9:
    lVar1 = 0xd;
    goto LAB_0016b7ec;
  case divideequal:
    pcVar2 = "divideequal";
LAB_0016b5e9:
    lVar1 = 0xb;
    goto LAB_0016b7ec;
  case andequal:
    pcVar2 = "andequal";
    goto LAB_0016b776;
  case orequal:
    pcVar2 = "orequal";
    goto LAB_0016b757;
  case xorequal:
    pcVar2 = "xorequal";
    goto LAB_0016b776;
  case modequal:
    pcVar2 = "modequal";
    goto LAB_0016b776;
  case equal:
    pcVar2 = "equal";
    goto LAB_0016b73d;
  case gt:
    pcVar2 = "gt";
    goto LAB_0016b5fa;
  case lt:
    pcVar2 = "lt";
    goto LAB_0016b5fa;
  case comma:
    pcVar2 = "comma";
    goto LAB_0016b73d;
  case not_:
    pcVar2 = "not_";
    goto LAB_0016b7bf;
  case tilde:
    pcVar2 = "tilde";
    goto LAB_0016b73d;
  case question:
    pcVar2 = "question";
    goto LAB_0016b776;
  case colon:
    pcVar2 = "colon";
    goto LAB_0016b73d;
  case dot:
    pcVar2 = "dot";
    goto LAB_0016b7cd;
  case plus:
    pcVar2 = "plus";
    goto LAB_0016b7bf;
  case minus:
    pcVar2 = "minus";
    goto LAB_0016b73d;
  case multiply:
    pcVar2 = "multiply";
    goto LAB_0016b776;
  case divide:
    pcVar2 = "divide";
    break;
  case and_:
    pcVar2 = "and_";
    goto LAB_0016b7bf;
  case or_:
    pcVar2 = "or_";
    goto LAB_0016b7cd;
  case xor_:
    pcVar2 = "xor_";
    goto LAB_0016b7bf;
  case mod:
    pcVar2 = "mod";
    goto LAB_0016b7cd;
  case lparen:
    pcVar2 = "lparen";
    break;
  case rparen:
    pcVar2 = "rparen";
    break;
  case lbrace:
    pcVar2 = "lbrace";
    break;
  case rbrace:
    pcVar2 = "rbrace";
    break;
  case lbracket:
    pcVar2 = "lbracket";
    goto LAB_0016b776;
  case rbracket:
    pcVar2 = "rbracket";
    goto LAB_0016b776;
  case semicolon:
    pcVar2 = "semicolon";
    goto LAB_0016b768;
  case abstract_:
    pcVar2 = "abstract";
    goto LAB_0016b776;
  case boolean_:
    pcVar2 = "boolean";
    goto LAB_0016b757;
  case break_:
    pcVar2 = "break";
    goto LAB_0016b73d;
  case byte_:
    pcVar2 = "byte";
    goto LAB_0016b7bf;
  case case_:
    pcVar2 = "case";
    goto LAB_0016b7bf;
  case catch_:
    pcVar2 = "catch";
    goto LAB_0016b73d;
  case char_:
    pcVar2 = "char";
    goto LAB_0016b7bf;
  case class_:
    pcVar2 = "class";
    goto LAB_0016b73d;
  case const_:
    pcVar2 = "const";
    goto LAB_0016b73d;
  case continue_:
    pcVar2 = "continue";
    goto LAB_0016b776;
  case debugger_:
    pcVar2 = "debugger";
    goto LAB_0016b776;
  case default_:
    pcVar2 = "default";
    goto LAB_0016b757;
  case delete_:
    pcVar2 = "delete";
    break;
  case do_:
    pcVar2 = "do";
    goto LAB_0016b5fa;
  case double_:
    pcVar2 = "double";
    break;
  case else_:
    pcVar2 = "else";
    goto LAB_0016b7bf;
  case enum_:
    pcVar2 = "enum";
    goto LAB_0016b7bf;
  case export_:
    pcVar2 = "export";
    break;
  case extends_:
    pcVar2 = "extends";
    goto LAB_0016b757;
  case false_:
    pcVar2 = "false";
    goto LAB_0016b73d;
  case final_:
    pcVar2 = "final";
    goto LAB_0016b73d;
  case finally_:
    pcVar2 = "finally";
    goto LAB_0016b757;
  case float_:
    pcVar2 = "float";
    goto LAB_0016b73d;
  case for_:
    pcVar2 = "for";
    goto LAB_0016b7cd;
  case function_:
    pcVar2 = "function";
    goto LAB_0016b776;
  case goto_:
    pcVar2 = "goto";
    goto LAB_0016b7bf;
  case if_:
    pcVar2 = "if";
    goto LAB_0016b5fa;
  case implements_:
    pcVar2 = "implements";
    goto LAB_0016b62f;
  case import_:
    pcVar2 = "import";
    break;
  case in_:
    pcVar2 = "in";
LAB_0016b5fa:
    lVar1 = 2;
    goto LAB_0016b7ec;
  case instanceof_:
    pcVar2 = "instanceof";
LAB_0016b62f:
    lVar1 = 10;
    goto LAB_0016b7ec;
  case int_:
    pcVar2 = "int";
    goto LAB_0016b7cd;
  case interface_:
    pcVar2 = "interface";
    goto LAB_0016b768;
  case let_:
    pcVar2 = "let";
    goto LAB_0016b7cd;
  case long_:
    pcVar2 = "long";
    goto LAB_0016b7bf;
  case native_:
    pcVar2 = "native";
    break;
  case new_:
    pcVar2 = "new";
    goto LAB_0016b7cd;
  case null_:
    pcVar2 = "null";
    goto LAB_0016b7bf;
  case package_:
    pcVar2 = "package";
    goto LAB_0016b757;
  case private_:
    pcVar2 = "private";
LAB_0016b757:
    lVar1 = 7;
    goto LAB_0016b7ec;
  case protected_:
    pcVar2 = "protected";
    goto LAB_0016b768;
  case public_:
    pcVar2 = "public";
    break;
  case return_:
    pcVar2 = "return";
    break;
  case short_:
    pcVar2 = "short";
    goto LAB_0016b73d;
  case static_:
    pcVar2 = "static";
    break;
  case super_:
    pcVar2 = "super";
    goto LAB_0016b73d;
  case switch_:
    pcVar2 = "switch";
    break;
  case synchronized_:
    pcVar2 = "synchronized";
    lVar1 = 0xc;
    goto LAB_0016b7ec;
  case this_:
    pcVar2 = "this";
    goto LAB_0016b7bf;
  case throw_:
    pcVar2 = "throw";
    goto LAB_0016b73d;
  case throws_:
    pcVar2 = "throws";
    break;
  case transient_:
    pcVar2 = "transient";
LAB_0016b768:
    lVar1 = 9;
    goto LAB_0016b7ec;
  case true_:
    pcVar2 = "true";
    goto LAB_0016b7bf;
  case try_:
    pcVar2 = "try";
    goto LAB_0016b7cd;
  case typeof_:
    pcVar2 = "typeof";
    break;
  case var_:
    pcVar2 = "var";
    goto LAB_0016b7cd;
  case void_:
    pcVar2 = "void";
    goto LAB_0016b7bf;
  case volatile_:
    pcVar2 = "volatile";
LAB_0016b776:
    lVar1 = 8;
    goto LAB_0016b7ec;
  case while_:
    pcVar2 = "while";
    goto LAB_0016b73d;
  case with_:
    pcVar2 = "with";
LAB_0016b7bf:
    lVar1 = 4;
    goto LAB_0016b7ec;
  case yield_:
    pcVar2 = "yield";
LAB_0016b73d:
    lVar1 = 5;
    goto LAB_0016b7ec;
  case eof:
    pcVar2 = "eof";
LAB_0016b7cd:
    lVar1 = 3;
    goto LAB_0016b7ec;
  default:
    std::__ostream_insert<char,std::char_traits<char>>(os,"token_type{",0xb);
    os = (ostream *)std::ostream::operator<<((ostream *)os,t);
    pcVar2 = "}";
    lVar1 = 1;
    goto LAB_0016b7ec;
  }
  lVar1 = 6;
LAB_0016b7ec:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, token_type t) {
    switch (t) {
#define CASE_TOKEN_TYPE(n) case token_type::n: return os << #n;
        CASE_TOKEN_TYPE(whitespace)
        CASE_TOKEN_TYPE(line_terminator)
        CASE_TOKEN_TYPE(identifier)
        CASE_TOKEN_TYPE(numeric_literal)
        CASE_TOKEN_TYPE(string_literal)
        CASE_TOKEN_TYPE(eof)
#undef CASE_TOKEN_TYPE
#define CASE_PUNCTUATOR(n, ...) case token_type::n: return os << #n;
        MJS_PUNCTUATORS(CASE_PUNCTUATOR)
#undef CASE_PUNCTUATOR
#define CASE_KEYWORD(n, ...) case token_type::n ## _: return os << #n;
        MJS_KEYWORDS(CASE_KEYWORD)
#undef CASE_KEYWORD
    }
    return os << "token_type{" << (int)t << "}";
}